

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O0

void slang::ast::CoverCrossSymbol::fromSyntax
               (Scope *scope,CoverCrossSyntax *syntax,
               SmallVectorBase<const_slang::ast::Symbol_*> *results)

{
  CoverCrossSymbol *this;
  bool bVar1;
  int iVar2;
  Compilation *args;
  undefined4 extraout_var;
  DeclaredType *typeLink;
  CoverageOptionSyntax *syntax_00;
  EVP_PKEY_CTX *src;
  string_view sVar3;
  const_iterator cVar4;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  LookupLocation lookupLocation;
  CoverCrossSymbol *local_3e8;
  span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL> local_3e0;
  MemberSyntax *local_3d0;
  MemberSyntax *member;
  iterator __end2_2;
  iterator __begin2_2;
  SyntaxList<slang::syntax::MemberSyntax> *__range2_2;
  OptionBuilder options;
  TypeAliasType *queueType_t;
  QueueType *local_1c0;
  QueueType *queueType;
  TypeAliasType *valType_t;
  size_t local_1a8;
  char *pcStack_1a0;
  CoverpointSymbol *local_198;
  CoverpointSymbol *item_1;
  iterator __end2_1;
  iterator __begin2_1;
  SmallVector<const_slang::ast::CoverpointSymbol_*,_5UL> *__range2_1;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined1 local_160 [8];
  StructBuilder valType;
  CoverCrossBodySymbol *body;
  span<const_slang::ast::CoverpointSymbol_*,_18446744073709551615UL> local_130;
  CoverCrossSymbol *local_120;
  CoverCrossSymbol *result;
  Compilation *comp;
  Compilation *local_108;
  Compilation *local_100;
  CoverpointSymbol *newPoint;
  string_view local_f0;
  Symbol *local_e0;
  Symbol *symbol;
  IdentifierNameSyntax *item;
  const_iterator __end2;
  undefined1 local_b0 [8];
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *__range2;
  SmallVector<const_slang::ast::CoverpointSymbol_*,_5UL> targets;
  SourceLocation local_48;
  SourceLocation local_38;
  SourceLocation loc;
  string_view name;
  SmallVectorBase<const_slang::ast::Symbol_*> *results_local;
  CoverCrossSyntax *syntax_local;
  Scope *scope_local;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&loc);
  SourceLocation::SourceLocation(&local_38);
  if (syntax->label == (NamedLabelSyntax *)0x0) {
    targets.stackBase._24_8_ = parsing::Token::location(&syntax->cross);
    local_38 = (SourceLocation)targets.stackBase._24_8_;
  }
  else {
    sVar3 = parsing::Token::valueText(&syntax->label->name);
    local_48 = (SourceLocation)sVar3._M_len;
    loc = local_48;
    local_38 = parsing::Token::location(&syntax->label->name);
  }
  SmallVector<const_slang::ast::CoverpointSymbol_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::CoverpointSymbol_*,_5UL> *)&__range2);
  __begin2.index = (size_t)&syntax->items;
  cVar4 = slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::begin
                    ((SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *)__begin2.index);
  __begin2.list = (ParentList *)cVar4.index;
  local_b0 = (undefined1  [8])cVar4.list;
  cVar4 = slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::end
                    ((SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *)__begin2.index);
  while( true ) {
    __end2.list = (ParentList *)cVar4.index;
    item = (IdentifierNameSyntax *)cVar4.list;
    bVar1 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<const_slang::syntax::IdentifierNameSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::IdentifierNameSyntax_*,_unsigned_long,_const_slang::syntax::IdentifierNameSyntax_**,_const_slang::syntax::IdentifierNameSyntax_*&>
            ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<const_slang::syntax::IdentifierNameSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::IdentifierNameSyntax_*,_unsigned_long,_const_slang::syntax::IdentifierNameSyntax_**,_const_slang::syntax::IdentifierNameSyntax_*&>
                          *)local_b0,
                         (iterator_base<const_slang::syntax::IdentifierNameSyntax_*> *)&item);
    if (!bVar1) break;
    symbol = (Symbol *)
             slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::
             iterator_base<const_slang::syntax::IdentifierNameSyntax_*>::operator*
                       ((iterator_base<const_slang::syntax::IdentifierNameSyntax_*> *)local_b0);
    sVar3 = parsing::Token::valueText((Token *)&(symbol->name)._M_str);
    local_f0 = sVar3;
    local_e0 = Scope::find(scope,sVar3);
    if ((local_e0 == (Symbol *)0x0) || (local_e0->kind != Coverpoint)) {
      local_108 = (Compilation *)
                  CoverpointSymbol::fromImplicit(scope,(IdentifierNameSyntax *)symbol);
      local_100 = local_108;
      SmallVectorBase<const_slang::ast::CoverpointSymbol_*>::push_back
                ((SmallVectorBase<const_slang::ast::CoverpointSymbol_*> *)&__range2,
                 (CoverpointSymbol **)&local_108);
      comp = local_100;
      SmallVectorBase<const_slang::ast::Symbol_*>::push_back(results,(Symbol **)&comp);
    }
    else {
      newPoint = Symbol::as<slang::ast::CoverpointSymbol>(local_e0);
      SmallVectorBase<const_slang::ast::CoverpointSymbol_*>::push_back
                ((SmallVectorBase<const_slang::ast::CoverpointSymbol_*> *)&__range2,&newPoint);
    }
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<const_slang::syntax::IdentifierNameSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::IdentifierNameSyntax_*,_unsigned_long,_const_slang::syntax::IdentifierNameSyntax_**,_const_slang::syntax::IdentifierNameSyntax_*&>
    ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<const_slang::syntax::IdentifierNameSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::IdentifierNameSyntax_*,_unsigned_long,_const_slang::syntax::IdentifierNameSyntax_**,_const_slang::syntax::IdentifierNameSyntax_*&>
                  *)local_b0);
    cVar4.index = (size_t)__end2.list;
    cVar4.list = (ParentList *)item;
  }
  args = Scope::getCompilation(scope);
  result = (CoverCrossSymbol *)args;
  iVar2 = SmallVectorBase<const_slang::ast::CoverpointSymbol_*>::copy
                    ((SmallVectorBase<const_slang::ast::CoverpointSymbol_*> *)&__range2,
                     (EVP_PKEY_CTX *)args,src);
  local_130.data_ = (pointer)CONCAT44(extraout_var,iVar2);
  local_120 = BumpAllocator::
              emplace<slang::ast::CoverCrossSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,nonstd::span_lite::span<slang::ast::CoverpointSymbol_const*,18446744073709551615ul>>
                        (&args->super_BumpAllocator,args,
                         (basic_string_view<char,_std::char_traits<char>_> *)&loc,&local_38,
                         &local_130);
  Symbol::setSyntax(&local_120->super_Symbol,(SyntaxNode *)syntax);
  this = local_120;
  syntax_01 = slang::syntax::SyntaxList::operator_cast_to_span
                        ((SyntaxList *)&(syntax->super_MemberSyntax).attributes);
  Symbol::setAttributes(&this->super_Symbol,scope,syntax_01);
  valType._16_8_ =
       BumpAllocator::
       emplace<slang::ast::CoverCrossBodySymbol,slang::ast::Compilation&,slang::SourceLocation&>
                 ((BumpAllocator *)result,(Compilation *)result,&local_38);
  Scope::addMember(&local_120->super_Scope,(Symbol *)valType._16_8_);
  __range2_1 = LookupLocation::min;
  uStack_170 = (undefined4)DAT_0091b928;
  uStack_16c = (undefined4)((ulong)DAT_0091b928 >> 0x20);
  lookupLocation.index = uStack_170;
  lookupLocation.scope = (Scope *)LookupLocation::min;
  lookupLocation._12_4_ = 0;
  StructBuilder::StructBuilder
            ((StructBuilder *)local_160,(Scope *)(valType._16_8_ + 0x40),lookupLocation);
  __begin2_1 = (iterator)&__range2;
  __end2_1 = SmallVectorBase<const_slang::ast::CoverpointSymbol_*>::begin
                       ((SmallVectorBase<const_slang::ast::CoverpointSymbol_*> *)__begin2_1);
  item_1 = (CoverpointSymbol *)
           SmallVectorBase<const_slang::ast::CoverpointSymbol_*>::end
                     ((SmallVectorBase<const_slang::ast::CoverpointSymbol_*> *)__begin2_1);
  for (; (CoverpointSymbol *)__end2_1 != item_1; __end2_1 = __end2_1 + 1) {
    local_198 = *__end2_1;
    local_1a8 = (local_198->super_Symbol).name._M_len;
    pcStack_1a0 = (local_198->super_Symbol).name._M_str;
    typeLink = &local_198->declaredType;
    bitmask<slang::ast::VariableFlags>::bitmask
              ((bitmask<slang::ast::VariableFlags> *)((long)&valType_t + 6),None);
    sVar3._M_str = pcStack_1a0;
    sVar3._M_len = local_1a8;
    StructBuilder::addField((StructBuilder *)local_160,sVar3,typeLink,valType_t._6_2_);
  }
  queueType = (QueueType *)
              BumpAllocator::
              emplace<slang::ast::TypeAliasType,char_const(&)[13],slang::SourceLocation&>
                        ((BumpAllocator *)result,(char (*) [13])"CrossValType",&local_38);
  DeclaredType::setType(&((TypeAliasType *)queueType)->targetType,(Type *)valType.compilation);
  Scope::addMember((Scope *)(valType._16_8_ + 0x40),(Symbol *)queueType);
  queueType_t._4_4_ = 0;
  local_1c0 = BumpAllocator::emplace<slang::ast::QueueType,slang::ast::TypeAliasType&,unsigned_int>
                        ((BumpAllocator *)result,(TypeAliasType *)queueType,
                         (uint *)((long)&queueType_t + 4));
  options.typeNames.
  super_flat_hash_map<std::basic_string_view<char>,_const_slang::syntax::SyntaxNode_*,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char>,_const_slang::syntax::SyntaxNode_*>_>,_4UL>_>
  .
  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>_>,_4UL>_>
  .num_elements =
       (size_t)BumpAllocator::
               emplace<slang::ast::TypeAliasType,char_const(&)[15],slang::SourceLocation&>
                         ((BumpAllocator *)result,(char (*) [15])"CrossQueueType",&local_38);
  DeclaredType::setType
            (&((TypeAliasType *)
              options.typeNames.
              super_flat_hash_map<std::basic_string_view<char>,_const_slang::syntax::SyntaxNode_*,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char>,_const_slang::syntax::SyntaxNode_*>_>,_4UL>_>
              .
              super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>_>,_4UL>_>
              .num_elements)->targetType,&local_1c0->super_Type);
  Scope::addMember((Scope *)(valType._16_8_ + 0x40),
                   (Symbol *)
                   options.typeNames.
                   super_flat_hash_map<std::basic_string_view<char>,_const_slang::syntax::SyntaxNode_*,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char>,_const_slang::syntax::SyntaxNode_*>_>,_4UL>_>
                   .
                   super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>_>,_4UL>_>
                   .num_elements);
  *(size_t *)(valType._16_8_ + 0x70) =
       options.typeNames.
       super_flat_hash_map<std::basic_string_view<char>,_const_slang::syntax::SyntaxNode_*,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char>,_const_slang::syntax::SyntaxNode_*>_>,_4UL>_>
       .
       super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>_>,_4UL>_>
       .num_elements;
  anon_unknown.dwarf_ebebc1::OptionBuilder::OptionBuilder
            ((OptionBuilder *)&__range2_2,&local_120->super_Scope);
  __begin2_2 = (iterator)&syntax->members;
  __end2_2 = nonstd::span_lite::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::begin
                       (&(syntax->members).
                         super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>);
  member = (MemberSyntax *)
           nonstd::span_lite::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::end
                     ((span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *)
                      (__begin2_2 + 4));
  for (; (MemberSyntax *)__end2_2 != member; __end2_2 = __end2_2 + 1) {
    local_3d0 = *__end2_2;
    if ((local_3d0->super_SyntaxNode).kind == CoverageOption) {
      syntax_00 = slang::syntax::SyntaxNode::as<slang::syntax::CoverageOptionSyntax>
                            (&local_3d0->super_SyntaxNode);
      anon_unknown.dwarf_ebebc1::OptionBuilder::add((OptionBuilder *)&__range2_2,syntax_00);
    }
    else {
      Scope::addMembers((Scope *)(valType._16_8_ + 0x40),&local_3d0->super_SyntaxNode);
    }
  }
  local_3e0 = anon_unknown.dwarf_ebebc1::OptionBuilder::get((OptionBuilder *)&__range2_2);
  local_120->options = local_3e0;
  local_3e8 = local_120;
  SmallVectorBase<const_slang::ast::Symbol_*>::push_back(results,(Symbol **)&local_3e8);
  anon_unknown.dwarf_ebebc1::OptionBuilder::~OptionBuilder((OptionBuilder *)&__range2_2);
  SmallVector<const_slang::ast::CoverpointSymbol_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::CoverpointSymbol_*,_5UL> *)&__range2);
  return;
}

Assistant:

void CoverCrossSymbol::fromSyntax(const Scope& scope, const CoverCrossSyntax& syntax,
                                  SmallVectorBase<const Symbol*>& results) {
    string_view name;
    SourceLocation loc;
    if (syntax.label) {
        name = syntax.label->name.valueText();
        loc = syntax.label->name.location();
    }
    else {
        loc = syntax.cross.location();
    }

    SmallVector<const CoverpointSymbol*> targets;
    for (auto item : syntax.items) {
        auto symbol = scope.find(item->identifier.valueText());
        if (symbol && symbol->kind == SymbolKind::Coverpoint) {
            targets.push_back(&symbol->as<CoverpointSymbol>());
        }
        else {
            // If we didn't find a coverpoint, create one implicitly
            // that will be initialized with this expression.
            auto& newPoint = CoverpointSymbol::fromImplicit(scope, *item);
            targets.push_back(&newPoint);
            results.push_back(&newPoint);
        }
    }

    auto& comp = scope.getCompilation();
    auto result = comp.emplace<CoverCrossSymbol>(comp, name, loc, targets.copy(comp));
    result->setSyntax(syntax);
    result->setAttributes(scope, syntax.attributes);

    auto body = comp.emplace<CoverCrossBodySymbol>(comp, loc);
    result->addMember(*body);

    StructBuilder valType(*body, LookupLocation::min);
    for (auto item : targets)
        valType.addField(item->name, item->declaredType);

    auto valType_t = comp.emplace<TypeAliasType>("CrossValType", loc);
    valType_t->targetType.setType(valType.type);
    body->addMember(*valType_t);

    auto queueType = comp.emplace<QueueType>(*valType_t, 0u);
    auto queueType_t = comp.emplace<TypeAliasType>("CrossQueueType", loc);
    queueType_t->targetType.setType(*queueType);
    body->addMember(*queueType_t);
    body->crossQueueType = queueType_t;

    OptionBuilder options(*result);
    for (auto member : syntax.members) {
        if (member->kind == SyntaxKind::CoverageOption)
            options.add(member->as<CoverageOptionSyntax>());
        else
            body->addMembers(*member);
    }

    result->options = options.get();
    results.push_back(result);
}